

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::ForeachLoopListSyntax::ForeachLoopListSyntax
          (ForeachLoopListSyntax *this,Token openParen,NameSyntax *arrayName,Token openBracket,
          SeparatedSyntaxList<slang::syntax::NameSyntax> *loopVariables,Token closeBracket,
          Token closeParen)

{
  Token TVar1;
  Token TVar2;
  bool bVar3;
  NameSyntax *pNVar4;
  NameSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *local_38;
  NameSyntax *arrayName_local;
  ForeachLoopListSyntax *this_local;
  Token openBracket_local;
  Token openParen_local;
  
  TVar2 = closeParen;
  TVar1 = closeBracket;
  openBracket_local._0_8_ = openBracket.info;
  this_local = openBracket._0_8_;
  openBracket_local.info = openParen._0_8_;
  local_38 = (SeparatedSyntaxList<slang::syntax::NameSyntax> *)arrayName;
  arrayName_local = (NameSyntax *)this;
  SyntaxNode::SyntaxNode(&this->super_SyntaxNode,ForeachLoopList);
  *(Info **)&this->openParen = openBracket_local.info;
  (this->openParen).info = openParen.info;
  __range2 = local_38;
  not_null<slang::syntax::NameSyntax*>::not_null<slang::syntax::NameSyntax*,void>
            ((not_null<slang::syntax::NameSyntax*> *)&this->arrayName,(NameSyntax **)&__range2);
  *(ForeachLoopListSyntax **)&this->openBracket = this_local;
  (this->openBracket).info = (Info *)openBracket_local._0_8_;
  SeparatedSyntaxList<slang::syntax::NameSyntax>::SeparatedSyntaxList
            (&this->loopVariables,loopVariables);
  (this->closeBracket).kind = closeBracket.kind;
  (this->closeBracket).field_0x2 = closeBracket._2_1_;
  (this->closeBracket).numFlags = (NumericTokenFlags)closeBracket.numFlags.raw;
  (this->closeBracket).rawLen = closeBracket.rawLen;
  closeBracket.info = TVar1.info;
  (this->closeBracket).info = closeBracket.info;
  (this->closeParen).kind = closeParen.kind;
  (this->closeParen).field_0x2 = closeParen._2_1_;
  (this->closeParen).numFlags = (NumericTokenFlags)closeParen.numFlags.raw;
  (this->closeParen).rawLen = closeParen.rawLen;
  closeParen.info = TVar2.info;
  (this->closeParen).info = closeParen.info;
  pNVar4 = not_null<slang::syntax::NameSyntax_*>::operator->(&this->arrayName);
  (pNVar4->super_ExpressionSyntax).super_SyntaxNode.parent = &this->super_SyntaxNode;
  (this->loopVariables).super_SyntaxListBase.super_SyntaxNode.parent = &this->super_SyntaxNode;
  join_0x00000010_0x00000000_ =
       SeparatedSyntaxList<slang::syntax::NameSyntax>::begin(&this->loopVariables);
  _child = SeparatedSyntaxList<slang::syntax::NameSyntax>::end(&this->loopVariables);
  while( true ) {
    bVar3 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::NameSyntax_*,_unsigned_long,_slang::syntax::NameSyntax_**,_slang::syntax::NameSyntax_*&>
            ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::NameSyntax_*,_unsigned_long,_slang::syntax::NameSyntax_**,_slang::syntax::NameSyntax_*&>
                          *)&__end2.index,(iterator_base<slang::syntax::NameSyntax_*> *)&child);
    if (!bVar3) break;
    pNVar4 = SeparatedSyntaxList<slang::syntax::NameSyntax>::
             iterator_base<slang::syntax::NameSyntax_*>::operator*
                       ((iterator_base<slang::syntax::NameSyntax_*> *)&__end2.index);
    (pNVar4->super_ExpressionSyntax).super_SyntaxNode.parent = &this->super_SyntaxNode;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::NameSyntax_*,_unsigned_long,_slang::syntax::NameSyntax_**,_slang::syntax::NameSyntax_*&>
    ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::NameSyntax_*,_unsigned_long,_slang::syntax::NameSyntax_**,_slang::syntax::NameSyntax_*&>
                  *)&__end2.index);
  }
  return;
}

Assistant:

ForeachLoopListSyntax(Token openParen, NameSyntax& arrayName, Token openBracket, const SeparatedSyntaxList<NameSyntax>& loopVariables, Token closeBracket, Token closeParen) :
        SyntaxNode(SyntaxKind::ForeachLoopList), openParen(openParen), arrayName(&arrayName), openBracket(openBracket), loopVariables(loopVariables), closeBracket(closeBracket), closeParen(closeParen) {
        this->arrayName->parent = this;
        this->loopVariables.parent = this;
        for (auto child : this->loopVariables)
            child->parent = this;
    }